

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_heap.c
# Opt level: O2

sexp load_image_callback_p1(sexp ctx,sexp p,void *user)

{
  uchar **ppuVar1;
  sexp_uint_t *psVar2;
  sexp_tag_t sVar3;
  sexp psVar4;
  
  psVar4 = sexp_adjust_fields(p,*(sexp_conflict **)((long)user + 0x10),load_image_src_to_dst,user);
  if (psVar4 == (sexp)&DAT_0000013e) {
    if (((ulong)p & 3) == 0) {
      sVar3 = p->tag;
      if (sVar3 - 0x10 < 2) {
        if ((p->value).type.getters != (sexp)0x0) {
          (p->value).type.getters = (sexp)0x0;
          (p->value).flonum_bits[0x28] = '\0';
          p->field_0x5 = p->field_0x5 & 0xfd;
        }
      }
      else if (sVar3 == 0x18) {
        psVar4 = sexp_adjust_bytecode(p,load_image_src_to_dst,user);
        if (psVar4 != (sexp)&DAT_0000013e) {
          return psVar4;
        }
      }
      else if (sVar3 == 0x1a) {
        (p->value).type.cpl = (sexp)0x0;
      }
      else if (sVar3 == 0x24) {
        ppuVar1 = &(p->value).context.ip;
        *ppuVar1 = *ppuVar1 + *user;
        psVar2 = &(p->value).context.last_fp;
        *psVar2 = *psVar2 + *user;
        (((p->value).type.name)->value).type.cpl = (sexp)0x0;
        (p->value).context.saves = (sexp_gc_var_t *)0x0;
        (p->value).type.finalize = *(sexp_proc2 *)((long)user + 8);
      }
    }
    psVar4 = (sexp)&DAT_0000013e;
  }
  return psVar4;
}

Assistant:

static sexp load_image_callback_p1 (sexp ctx, sexp p, void *user) {
  sexp res = NULL;
  struct load_image_state* state = user;

  if ((res = sexp_adjust_fields(p, state->types, load_image_src_to_dst, state)) != SEXP_TRUE) {
    goto done; }
    
  if (sexp_contextp(p)) {
#if SEXP_USE_GREEN_THREADS
    sexp_context_ip(p) += state->offset;
#endif
    sexp_context_last_fp(p) += state->offset;
    sexp_stack_top(sexp_context_stack(p)) = 0;
    sexp_context_saves(p) = NULL;
    sexp_context_heap(p) = state->heap;
  
  } else if (sexp_bytecodep(p)) {
    if ((res = sexp_adjust_bytecode(p, load_image_src_to_dst, state)) != SEXP_TRUE) {
      goto done; }
    
  } else if (sexp_portp(p) && sexp_port_stream(p)) {
    sexp_port_stream(p) = 0;
    sexp_port_openp(p) = 0;
    sexp_freep(p) = 0;
    
  } else if (sexp_dlp(p)) {
    sexp_dl_handle(p) = NULL;

  }
  res = SEXP_TRUE;
done:
  return res;
}